

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O2

void Refal2::CUnitList::Print
               (CUnitNode *begin,CUnitNode *end,ostream *outputStream,CPrintHelper *printHelper)

{
  uint __line;
  char *__assertion;
  
  if (begin == (CUnitNode *)0x0) {
    __assertion = "begin != nullptr";
    __line = 100;
  }
  else if (end == (CUnitNode *)0x0) {
    __assertion = "end != nullptr";
    __line = 0x65;
  }
  else {
    do {
      CUnit::Print(&begin->super_CUnit,outputStream,printHelper);
      if (begin == end) {
        return;
      }
      begin = begin->next;
    } while (begin != (CNode<Refal2::CUnit> *)0x0);
    __assertion = "node != nullptr";
    __line = 0x6a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                ,__line,
                "static void Refal2::CUnitList::Print(const CUnitNode *, const CUnitNode *, std::ostream &, const CPrintHelper &)"
               );
}

Assistant:

void CUnitList::Print( const CUnitNode* begin, const CUnitNode* end,
	std::ostream& outputStream,	const CPrintHelper& printHelper )
{
	assert( begin != nullptr );
	assert( end != nullptr );
	const CUnitNode* node = begin;
	while( node != end ) {
		node->Print( outputStream, printHelper );
		node = node->Next();
		assert( node != nullptr );
	}
	node->Print( outputStream, printHelper );
}